

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void analyzeAggFuncArgs(AggInfo *pAggInfo,NameContext *pNC)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  uVar2 = pNC->ncFlags | 0x20000;
  pNC->ncFlags = uVar2;
  if (0 < pAggInfo->nFunc) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      lVar1 = *(long *)((long)&pAggInfo->aFunc->pFExpr + lVar4);
      sqlite3ExprAnalyzeAggList(pNC,*(ExprList **)(lVar1 + 0x20));
      if (*(long *)(lVar1 + 0x10) != 0) {
        sqlite3ExprAnalyzeAggList(pNC,*(ExprList **)(*(long *)(lVar1 + 0x10) + 0x20));
      }
      if ((*(byte *)(lVar1 + 7) & 1) != 0) {
        sqlite3ExprAnalyzeAggregates(pNC,*(Expr **)(*(long *)(lVar1 + 0x40) + 0x48));
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar3 < pAggInfo->nFunc);
    uVar2 = pNC->ncFlags;
  }
  pNC->ncFlags = uVar2 & 0xfffdffff;
  return;
}

Assistant:

static void analyzeAggFuncArgs(
  AggInfo *pAggInfo,
  NameContext *pNC
){
  int i;
  assert( pAggInfo!=0 );
  assert( pAggInfo->iFirstReg==0 );
  pNC->ncFlags |= NC_InAggFunc;
  for(i=0; i<pAggInfo->nFunc; i++){
    Expr *pExpr = pAggInfo->aFunc[i].pFExpr;
    assert( pExpr->op==TK_FUNCTION || pExpr->op==TK_AGG_FUNCTION );
    assert( ExprUseXList(pExpr) );
    sqlite3ExprAnalyzeAggList(pNC, pExpr->x.pList);
    if( pExpr->pLeft ){
      assert( pExpr->pLeft->op==TK_ORDER );
      assert( ExprUseXList(pExpr->pLeft) );
      sqlite3ExprAnalyzeAggList(pNC, pExpr->pLeft->x.pList);
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    assert( !IsWindowFunc(pExpr) );
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      sqlite3ExprAnalyzeAggregates(pNC, pExpr->y.pWin->pFilter);
    }
#endif
  }
  pNC->ncFlags &= ~NC_InAggFunc;
}